

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LatticeFactory.cpp
# Opt level: O1

Lattice * __thiscall OpenMD::LatticeFactory::createLattice(LatticeFactory *this,string *id)

{
  iterator iVar1;
  Lattice *pLVar2;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::LatticeCreator_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::LatticeCreator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::LatticeCreator_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::LatticeCreator_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::LatticeCreator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::LatticeCreator_*>_>_>
                  *)this,id);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->creatorMap_)._M_t._M_impl.super__Rb_tree_header) {
    pLVar2 = (Lattice *)(**(code **)(**(long **)(iVar1._M_node + 2) + 0x10))();
    return pLVar2;
  }
  return (Lattice *)0x0;
}

Assistant:

Lattice* LatticeFactory::createLattice(const std::string& id) {
    CreatorMapType::iterator i = creatorMap_.find(id);
    if (i != creatorMap_.end()) {
      // invoke functor to create object
      return (i->second)->create();
    } else {
      return NULL;
    }
  }